

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O3

int __thiscall
dynamicgraph::Signal<double,_int>::access(Signal<double,_int> *this,char *__name,int __type)

{
  double *pdVar1;
  Mutex *ppiVar2;
  int iVar3;
  double *pdVar4;
  undefined4 in_register_00000014;
  bool bVar5;
  
  if (this->signalType - REFERENCE < 2) {
    (this->super_SignalBase<int>).signalTime = *(int *)__name;
    pdVar1 = &this->Tcopy1;
    bVar5 = this->Tcopy == pdVar1;
    pdVar4 = &this->Tcopy2;
    if (!bVar5) {
      pdVar4 = pdVar1;
    }
    (&this->Tcopy1)[bVar5] = *this->Treference;
    this->copyInit = true;
  }
  else {
    if (this->signalType != FUNCTION) {
      if ((this->super_SignalBase<int>).ready == true) {
        (this->super_SignalBase<int>).ready = false;
        (*(this->super_SignalBase<int>)._vptr_SignalBase[3])
                  (this,__name,CONCAT44(in_register_00000014,__type));
      }
      iVar3 = (*(this->super_SignalBase<int>)._vptr_SignalBase[0x1d])(this);
      return iVar3;
    }
    pdVar1 = &this->Tcopy1;
    pdVar4 = pdVar1;
    if (this->Tcopy == pdVar1) {
      pdVar4 = &this->Tcopy2;
    }
    ppiVar2 = this->providerMutex;
    iVar3 = *(int *)__name;
    (this->super_SignalBase<int>).signalTime = iVar3;
    if (ppiVar2 == (Mutex *)0x0) {
      boost::function2<double_&,_double_&,_int>::operator()(&this->Tfunction,pdVar4,iVar3);
    }
    else {
      boost::function2<double_&,_double_&,_int>::operator()(&this->Tfunction,pdVar4,iVar3);
    }
    this->copyInit = true;
    pdVar4 = &this->Tcopy2;
    if (this->Tcopy != pdVar1) {
      pdVar4 = pdVar1;
    }
  }
  this->Tcopy = pdVar4;
  return (int)pdVar4;
}

Assistant:

const T &Signal<T, Time>::access(const Time &t) {
  switch (signalType) {
    case REFERENCE:
    case REFERENCE_NON_CONST: {
      if (NULL == providerMutex) {
        copyInit = true;
        signalTime = t;
        return setTcopy(*Treference);
      } else {
        try {
#ifdef HAVE_LIBBOOST_THREAD
          boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
          copyInit = true;
          signalTime = t;
          return setTcopy(*Treference);
        } catch (const MutexError &) {
          return accessCopy();
        }
      }

      break;
    }

    case FUNCTION: {
      if (NULL == providerMutex) {
        signalTime = t;
        Tfunction(getTwork(), t);
        copyInit = true;
        return switchTcopy();
      } else {
        try {
#ifdef HAVE_LIBBOOST_THREAD
          boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
          signalTime = t;
          Tfunction(getTwork(), t);
          copyInit = true;
          return switchTcopy();
        } catch (const MutexError &) {
          return accessCopy();
        }
      }
      break;
    }
    case CONSTANT:
    default:
      if (this->getReady()) {
        setReady(false);
        this->setTime(t);
      }
      return accessCopy();
  };
}